

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O3

Vec3<float> __thiscall
Imath_2_5::solidSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>(Imath_2_5 *this,Rand48 *rand)

{
  uint i;
  long lVar1;
  double dVar2;
  Vec3<float> VVar3;
  
  lVar1 = 0;
  do {
    do {
      dVar2 = erand48(rand->_state);
      *(float *)(this + lVar1 * 4) = (float)(dVar2 - (1.0 - dVar2));
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    VVar3.x = *(float *)this * *(float *)this + *(float *)(this + 4) * *(float *)(this + 4);
    VVar3.y = 0.0;
    VVar3.z = *(float *)(this + 8) * *(float *)(this + 8) + VVar3.x;
    lVar1 = 0;
  } while (1.0 < VVar3.z);
  return VVar3;
}

Assistant:

Vec
solidSphereRand (Rand &rand)
{
    Vec v;

    do
    {
	for (unsigned int i = 0; i < Vec::dimensions(); i++)
	    v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);
    }
    while (v.length2() > 1);

    return v;
}